

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_bpf_init_preallocated(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF)

{
  ma_result mVar1;
  
  if (pBPF != (ma_bpf *)0x0) {
    pBPF->pBPF2 = (ma_bpf2 *)0x0;
    pBPF->_pHeap = (void *)0x0;
    pBPF->format = ma_format_unknown;
    pBPF->channels = 0;
    *(undefined8 *)&pBPF->bpf2Count = 0;
    *(undefined8 *)&pBPF->_ownsHeap = 0;
    mVar1 = ma_bpf_reinit__internal(pConfig,pHeap,pBPF,1);
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_bpf_init_preallocated(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF)
{
    if (pBPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pBPF);

    return ma_bpf_reinit__internal(pConfig, pHeap, pBPF, /*isNew*/MA_TRUE);
}